

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *this;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 (*pauVar20) [16];
  bool bVar21;
  bool bVar22;
  ulong *puVar23;
  long lVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  long lVar29;
  undefined1 (*pauVar30) [16];
  uint uVar31;
  size_t i;
  byte bVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar52 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar82 [32];
  undefined1 auVar81 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar88 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar92 [32];
  undefined1 auVar91 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar35 [32];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  fVar1 = *(float *)&(context->query_radius).field_0;
  auVar49 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24f0 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_24f0 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_2400 = *(float *)&(query->p).field_0;
  fStack_23fc = local_2400;
  fStack_23f8 = local_2400;
  fStack_23f4 = local_2400;
  fStack_23f0 = local_2400;
  fStack_23ec = local_2400;
  fStack_23e8 = local_2400;
  fStack_23e4 = local_2400;
  local_2420 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  local_2440 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_243c = local_2440;
  fStack_2438 = local_2440;
  fStack_2434 = local_2440;
  fStack_2430 = local_2440;
  fStack_242c = local_2440;
  fStack_2428 = local_2440;
  fStack_2424 = local_2440;
  local_23c0 = (context->query_radius).field_0.m128[1];
  fStack_23bc = local_23c0;
  fStack_23b8 = local_23c0;
  fStack_23b4 = local_23c0;
  fStack_23b0 = local_23c0;
  fStack_23ac = local_23c0;
  fStack_23a8 = local_23c0;
  fStack_23a4 = local_23c0;
  local_23e0 = (context->query_radius).field_0.m128[2];
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  auVar63 = vshufps_avx(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar1)),0);
  auVar35._16_16_ = auVar63;
  auVar35._0_16_ = auVar63;
  bVar22 = false;
LAB_014ddf30:
  auVar36 = ZEXT3264(auVar35);
  auVar8._4_4_ = fStack_23fc;
  auVar8._0_4_ = local_2400;
  auVar8._8_4_ = fStack_23f8;
  auVar8._12_4_ = fStack_23f4;
  auVar8._16_4_ = fStack_23f0;
  auVar8._20_4_ = fStack_23ec;
  auVar8._24_4_ = fStack_23e8;
  auVar8._28_4_ = fStack_23e4;
  local_24c0 = auVar49._0_32_;
  local_2460 = vsubps_avx(auVar8,local_24c0);
  local_2480 = local_2400 + auVar49._0_4_;
  fStack_247c = fStack_23fc + auVar49._4_4_;
  fStack_2478 = fStack_23f8 + auVar49._8_4_;
  fStack_2474 = fStack_23f4 + auVar49._12_4_;
  fStack_2470 = fStack_23f0 + auVar49._16_4_;
  fStack_246c = fStack_23ec + auVar49._20_4_;
  fStack_2468 = fStack_23e8 + auVar49._24_4_;
  fStack_2464 = fStack_23e4 + auVar49._28_4_;
  auVar7._4_4_ = fStack_241c;
  auVar7._0_4_ = local_2420;
  auVar7._8_4_ = fStack_2418;
  auVar7._12_4_ = fStack_2414;
  auVar7._16_4_ = fStack_2410;
  auVar7._20_4_ = fStack_240c;
  auVar7._24_4_ = fStack_2408;
  auVar7._28_4_ = fStack_2404;
  auVar11._4_4_ = fStack_23bc;
  auVar11._0_4_ = local_23c0;
  auVar11._8_4_ = fStack_23b8;
  auVar11._12_4_ = fStack_23b4;
  auVar11._16_4_ = fStack_23b0;
  auVar11._20_4_ = fStack_23ac;
  auVar11._24_4_ = fStack_23a8;
  auVar11._28_4_ = fStack_23a4;
  local_24a0 = vsubps_avx(auVar7,auVar11);
  auVar49 = ZEXT3264(local_24a0);
  auVar59._0_4_ = local_2420 + local_23c0;
  auVar59._4_4_ = fStack_241c + fStack_23bc;
  auVar59._8_4_ = fStack_2418 + fStack_23b8;
  auVar59._12_4_ = fStack_2414 + fStack_23b4;
  auVar59._16_4_ = fStack_2410 + fStack_23b0;
  auVar59._20_4_ = fStack_240c + fStack_23ac;
  auVar59._24_4_ = fStack_2408 + fStack_23a8;
  auVar59._28_4_ = fStack_2404 + fStack_23a4;
  auVar10._4_4_ = fStack_243c;
  auVar10._0_4_ = local_2440;
  auVar10._8_4_ = fStack_2438;
  auVar10._12_4_ = fStack_2434;
  auVar10._16_4_ = fStack_2430;
  auVar10._20_4_ = fStack_242c;
  auVar10._24_4_ = fStack_2428;
  auVar10._28_4_ = fStack_2424;
  auVar9._4_4_ = fStack_23dc;
  auVar9._0_4_ = local_23e0;
  auVar9._8_4_ = fStack_23d8;
  auVar9._12_4_ = fStack_23d4;
  auVar9._16_4_ = fStack_23d0;
  auVar9._20_4_ = fStack_23cc;
  auVar9._24_4_ = fStack_23c8;
  auVar9._28_4_ = fStack_23c4;
  auVar10 = vsubps_avx(auVar10,auVar9);
  auVar60._0_4_ = local_2440 + local_23e0;
  auVar60._4_4_ = fStack_243c + fStack_23dc;
  auVar60._8_4_ = fStack_2438 + fStack_23d8;
  auVar60._12_4_ = fStack_2434 + fStack_23d4;
  auVar60._16_4_ = fStack_2430 + fStack_23d0;
  auVar60._20_4_ = fStack_242c + fStack_23cc;
  auVar60._24_4_ = fStack_2428 + fStack_23c8;
  auVar60._28_4_ = fStack_2424 + fStack_23c4;
  while( true ) {
    pauVar20 = pauVar28 + -1;
    pauVar28 = pauVar28 + -1;
    if ((float)local_24f0._0_4_ < *(float *)(*pauVar20 + 8)) break;
    pauVar20 = pauVar28;
    uVar33 = *(ulong *)*pauVar28;
LAB_014ddfab:
    pauVar28 = pauVar20;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar33 & 8) != 0) {
LAB_014de67a:
        lVar24 = (ulong)((uint)uVar33 & 0xf) - 8;
        local_24a0._0_8_ = lVar24;
        if (lVar24 == 0) break;
        lVar29 = (uVar33 & 0xfffffffffffffff0) + 0x40;
        lVar24 = 0;
        uVar26 = 0;
        goto LAB_014de6a0;
      }
      puVar23 = (ulong *)((uVar33 & 0xfffffffffffffff0) + 0x40);
      if ((uVar33 & 0xfffffffffffffff0) == 0) {
        puVar23 = (ulong *)0x0;
      }
      fVar1 = *(float *)(puVar23 + 6);
      fVar2 = *(float *)((long)puVar23 + 0x3c);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *puVar23;
      auVar63 = vpmovzxbd_avx(auVar67);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)((long)puVar23 + 4);
      auVar52 = vpmovzxbd_avx(auVar61);
      auVar72._16_16_ = auVar52;
      auVar72._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar72);
      auVar82._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar82._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar82._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar82._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar82._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar82._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar82._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar82._28_4_ = fVar1 + auVar7._28_4_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = puVar23[1];
      auVar63 = vpmovzxbd_avx(auVar75);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)((long)puVar23 + 0xc);
      auVar52 = vpmovzxbd_avx(auVar71);
      auVar97._16_16_ = auVar52;
      auVar97._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar97);
      auVar88._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar88._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar88._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar88._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar88._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar88._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar88._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar88._28_4_ = fVar1 + fVar2;
      fVar1 = *(float *)((long)puVar23 + 0x34);
      fVar2 = *(float *)(puVar23 + 8);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = puVar23[2];
      auVar63 = vpmovzxbd_avx(auVar90);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)((long)puVar23 + 0x14);
      auVar52 = vpmovzxbd_avx(auVar38);
      auVar46._16_16_ = auVar52;
      auVar46._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar46);
      auVar92._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar92._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar92._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar92._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar92._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar92._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar92._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar92._28_4_ = fVar1 + auVar7._28_4_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = puVar23[3];
      auVar63 = vpmovzxbd_avx(auVar39);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)((long)puVar23 + 0x1c);
      auVar52 = vpmovzxbd_avx(auVar50);
      auVar47._16_16_ = auVar52;
      auVar47._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar47);
      auVar48._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar48._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar48._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar48._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar48._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar48._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar48._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar48._28_4_ = fVar1 + auVar7._28_4_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = puVar23[4];
      auVar63 = vpmovzxbd_avx(auVar51);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)((long)puVar23 + 0x24);
      auVar52 = vpmovzxbd_avx(auVar95);
      auVar53._16_16_ = auVar52;
      auVar53._0_16_ = auVar63;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = puVar23[5];
      auVar63 = vpmovzxbd_avx(auVar96);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = *(ulong *)((long)puVar23 + 0x2c);
      auVar52 = vpmovzxbd_avx(auVar100);
      auVar98._16_16_ = auVar52;
      auVar98._0_16_ = auVar63;
      fVar1 = *(float *)((long)puVar23 + 0x44);
      auVar7 = vcvtdq2ps_avx(auVar53);
      auVar8 = vcvtdq2ps_avx(auVar98);
      fVar2 = *(float *)(puVar23 + 7);
      auVar54._0_4_ = fVar2 + fVar1 * auVar7._0_4_;
      auVar54._4_4_ = fVar2 + fVar1 * auVar7._4_4_;
      auVar54._8_4_ = fVar2 + fVar1 * auVar7._8_4_;
      auVar54._12_4_ = fVar2 + fVar1 * auVar7._12_4_;
      auVar54._16_4_ = fVar2 + fVar1 * auVar7._16_4_;
      auVar54._20_4_ = fVar2 + fVar1 * auVar7._20_4_;
      auVar54._24_4_ = fVar2 + fVar1 * auVar7._24_4_;
      auVar54._28_4_ = fVar2 + auVar7._28_4_;
      auVar99._0_4_ = fVar2 + fVar1 * auVar8._0_4_;
      auVar99._4_4_ = fVar2 + fVar1 * auVar8._4_4_;
      auVar99._8_4_ = fVar2 + fVar1 * auVar8._8_4_;
      auVar99._12_4_ = fVar2 + fVar1 * auVar8._12_4_;
      auVar99._16_4_ = fVar2 + fVar1 * auVar8._16_4_;
      auVar99._20_4_ = fVar2 + fVar1 * auVar8._20_4_;
      auVar99._24_4_ = fVar2 + fVar1 * auVar8._24_4_;
      auVar99._28_4_ = fVar2 + auVar8._28_4_;
      auVar16._4_4_ = fStack_241c;
      auVar16._0_4_ = local_2420;
      auVar16._8_4_ = fStack_2418;
      auVar16._12_4_ = fStack_2414;
      auVar16._16_4_ = fStack_2410;
      auVar16._20_4_ = fStack_240c;
      auVar16._24_4_ = fStack_2408;
      auVar16._28_4_ = fStack_2404;
      auVar7 = vmaxps_avx(auVar16,auVar92);
      auVar8 = vminps_avx(auVar7,auVar48);
      auVar14._4_4_ = fStack_243c;
      auVar14._0_4_ = local_2440;
      auVar14._8_4_ = fStack_2438;
      auVar14._12_4_ = fStack_2434;
      auVar13._16_4_ = fStack_2430;
      auVar13._0_16_ = auVar14;
      auVar13._20_4_ = fStack_242c;
      auVar13._24_4_ = fStack_2428;
      auVar13._28_4_ = fStack_2424;
      auVar7 = vmaxps_avx(auVar13,auVar54);
      auVar9 = vminps_avx(auVar7,auVar99);
      auVar18._4_4_ = fStack_23fc;
      auVar18._0_4_ = local_2400;
      auVar18._8_4_ = fStack_23f8;
      auVar18._12_4_ = fStack_23f4;
      auVar18._16_4_ = fStack_23f0;
      auVar18._20_4_ = fStack_23ec;
      auVar18._24_4_ = fStack_23e8;
      auVar18._28_4_ = fStack_23e4;
      auVar7 = vmaxps_avx(auVar18,auVar82);
      auVar7 = vminps_avx(auVar7,auVar88);
      auVar7 = vsubps_avx(auVar7,auVar18);
      auVar8 = vsubps_avx(auVar8,auVar16);
      auVar9 = vsubps_avx(auVar9,auVar13);
      local_24e0._0_4_ =
           auVar7._0_4_ * auVar7._0_4_ + auVar8._0_4_ * auVar8._0_4_ + auVar9._0_4_ * auVar9._0_4_;
      local_24e0._4_4_ =
           auVar7._4_4_ * auVar7._4_4_ + auVar8._4_4_ * auVar8._4_4_ + auVar9._4_4_ * auVar9._4_4_;
      fStack_24d8 = auVar7._8_4_ * auVar7._8_4_ + auVar8._8_4_ * auVar8._8_4_ +
                    auVar9._8_4_ * auVar9._8_4_;
      fStack_24d4 = auVar7._12_4_ * auVar7._12_4_ + auVar8._12_4_ * auVar8._12_4_ +
                    auVar9._12_4_ * auVar9._12_4_;
      fStack_24d0 = auVar7._16_4_ * auVar7._16_4_ + auVar8._16_4_ * auVar8._16_4_ +
                    auVar9._16_4_ * auVar9._16_4_;
      fStack_24cc = auVar7._20_4_ * auVar7._20_4_ + auVar8._20_4_ * auVar8._20_4_ +
                    auVar9._20_4_ * auVar9._20_4_;
      fStack_24c8 = auVar7._24_4_ * auVar7._24_4_ + auVar8._24_4_ * auVar8._24_4_ +
                    auVar9._24_4_ * auVar9._24_4_;
      fStack_24c4 = auVar7._28_4_ + auVar8._28_4_ + auVar9._28_4_;
      auVar7 = vcmpps_avx(auVar82,auVar88,2);
      auVar8 = vcmpps_avx(_local_24e0,auVar35,2);
      auVar7 = vandps_avx(auVar7,auVar8);
      auVar63 = vpminub_avx(auVar67,auVar75);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *puVar23;
      auVar52 = vpcmpeqb_avx(auVar68,auVar63);
      auVar63 = vpminub_avx(auVar71,auVar61);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)((long)puVar23 + 4);
      auVar63 = vpcmpeqb_avx(auVar63,auVar62);
      auVar40 = vpcmpeqd_avx(auVar14,auVar14);
      auVar49 = ZEXT1664(auVar40);
      auVar63 = vpmovsxbd_avx(auVar63 ^ auVar40);
      auVar63 = vpsrad_avx(auVar63,0x1f);
      auVar63 = vpandn_avx(auVar63,auVar7._16_16_);
      auVar52 = vpmovsxbd_avx(auVar52 ^ auVar40);
      auVar52 = vpsrad_avx(auVar52,0x1f);
      auVar52 = vpandn_avx(auVar52,auVar7._0_16_);
      auVar63 = vpackssdw_avx(auVar52,auVar63);
    }
    else {
      if ((uVar33 & 8) != 0) goto LAB_014de67a;
      puVar23 = (ulong *)((uVar33 & 0xfffffffffffffff0) + 0x40);
      if ((uVar33 & 0xfffffffffffffff0) == 0) {
        puVar23 = (ulong *)0x0;
      }
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *puVar23;
      auVar63 = vpmovzxbd_avx(auVar40);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)((long)puVar23 + 4);
      auVar52 = vpmovzxbd_avx(auVar64);
      auVar55._16_16_ = auVar52;
      auVar55._0_16_ = auVar63;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = puVar23[1];
      auVar63 = vpmovzxbd_avx(auVar69);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)((long)puVar23 + 0xc);
      auVar52 = vpmovzxbd_avx(auVar76);
      auVar73._16_16_ = auVar52;
      auVar73._0_16_ = auVar63;
      auVar63 = vpminub_avx(auVar69,auVar40);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *puVar23;
      auVar63 = vpcmpeqb_avx(auVar63,auVar52);
      auVar52 = vpcmpeqd_avx(auVar49._0_16_,auVar49._0_16_);
      auVar40 = vpmovsxbd_avx(auVar63 ^ auVar52);
      auVar63 = vpminub_avx(auVar76,auVar64);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)((long)puVar23 + 4);
      auVar63 = vpcmpeqb_avx(auVar63,auVar65);
      auVar63 = vpmovsxbd_avx(auVar63 ^ auVar52);
      auVar66._16_16_ = auVar63;
      auVar66._0_16_ = auVar40;
      fVar1 = *(float *)(puVar23 + 6);
      fVar2 = *(float *)((long)puVar23 + 0x3c);
      auVar7 = vcvtdq2ps_avx(auVar55);
      auVar70._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar70._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar70._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar70._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar70._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar70._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar70._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar70._28_4_ = fVar1 + auVar7._28_4_;
      auVar7 = vcvtdq2ps_avx(auVar73);
      auVar74._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar74._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar74._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar74._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar74._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar74._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar74._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar74._28_4_ = fVar1 + auVar7._28_4_;
      fVar1 = *(float *)((long)puVar23 + 0x34);
      fVar2 = *(float *)(puVar23 + 8);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = puVar23[2];
      auVar63 = vpmovzxbd_avx(auVar77);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)((long)puVar23 + 0x14);
      auVar52 = vpmovzxbd_avx(auVar80);
      auVar78._16_16_ = auVar52;
      auVar78._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar78);
      auVar79._0_4_ = auVar7._0_4_ * fVar2 + fVar1;
      auVar79._4_4_ = auVar7._4_4_ * fVar2 + fVar1;
      auVar79._8_4_ = auVar7._8_4_ * fVar2 + fVar1;
      auVar79._12_4_ = auVar7._12_4_ * fVar2 + fVar1;
      auVar79._16_4_ = auVar7._16_4_ * fVar2 + fVar1;
      auVar79._20_4_ = auVar7._20_4_ * fVar2 + fVar1;
      auVar79._24_4_ = auVar7._24_4_ * fVar2 + fVar1;
      auVar79._28_4_ = auVar7._28_4_ + fVar1;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = puVar23[3];
      auVar63 = vpmovzxbd_avx(auVar81);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)((long)puVar23 + 0x1c);
      auVar52 = vpmovzxbd_avx(auVar85);
      auVar83._16_16_ = auVar52;
      auVar83._0_16_ = auVar63;
      auVar7 = vcvtdq2ps_avx(auVar83);
      auVar84._0_4_ = fVar1 + auVar7._0_4_ * fVar2;
      auVar84._4_4_ = fVar1 + auVar7._4_4_ * fVar2;
      auVar84._8_4_ = fVar1 + auVar7._8_4_ * fVar2;
      auVar84._12_4_ = fVar1 + auVar7._12_4_ * fVar2;
      auVar84._16_4_ = fVar1 + auVar7._16_4_ * fVar2;
      auVar84._20_4_ = fVar1 + auVar7._20_4_ * fVar2;
      auVar84._24_4_ = fVar1 + auVar7._24_4_ * fVar2;
      auVar84._28_4_ = fVar1 + fVar2;
      fVar1 = *(float *)(puVar23 + 7);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = puVar23[4];
      auVar63 = vpmovzxbd_avx(auVar63);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)((long)puVar23 + 0x24);
      auVar52 = vpmovzxbd_avx(auVar86);
      auVar56._16_16_ = auVar52;
      auVar56._0_16_ = auVar63;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = puVar23[5];
      auVar63 = vpmovzxbd_avx(auVar87);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = *(ulong *)((long)puVar23 + 0x2c);
      auVar52 = vpmovzxbd_avx(auVar91);
      auVar93._16_16_ = auVar52;
      auVar93._0_16_ = auVar63;
      fVar2 = *(float *)((long)puVar23 + 0x44);
      auVar7 = vcvtdq2ps_avx(auVar56);
      auVar89._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar89._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar89._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar89._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar89._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar89._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar89._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar89._28_4_ = fVar1 + auVar7._28_4_;
      auVar7 = vcvtdq2ps_avx(auVar93);
      auVar94._0_4_ = fVar1 + fVar2 * auVar7._0_4_;
      auVar94._4_4_ = fVar1 + fVar2 * auVar7._4_4_;
      auVar94._8_4_ = fVar1 + fVar2 * auVar7._8_4_;
      auVar94._12_4_ = fVar1 + fVar2 * auVar7._12_4_;
      auVar94._16_4_ = fVar1 + fVar2 * auVar7._16_4_;
      auVar94._20_4_ = fVar1 + fVar2 * auVar7._20_4_;
      auVar94._24_4_ = fVar1 + fVar2 * auVar7._24_4_;
      auVar94._28_4_ = fVar1 + auVar7._28_4_;
      auVar19._4_4_ = fStack_23fc;
      auVar19._0_4_ = local_2400;
      auVar19._8_4_ = fStack_23f8;
      auVar19._12_4_ = fStack_23f4;
      auVar19._16_4_ = fStack_23f0;
      auVar19._20_4_ = fStack_23ec;
      auVar19._24_4_ = fStack_23e8;
      auVar19._28_4_ = fStack_23e4;
      auVar7 = vmaxps_avx(auVar19,auVar70);
      auVar7 = vminps_avx(auVar7,auVar74);
      auVar8 = vsubps_avx(auVar7,auVar19);
      auVar17._4_4_ = fStack_241c;
      auVar17._0_4_ = local_2420;
      auVar17._8_4_ = fStack_2418;
      auVar17._12_4_ = fStack_2414;
      auVar17._16_4_ = fStack_2410;
      auVar17._20_4_ = fStack_240c;
      auVar17._24_4_ = fStack_2408;
      auVar17._28_4_ = fStack_2404;
      auVar7 = vmaxps_avx(auVar17,auVar79);
      auVar7 = vminps_avx(auVar7,auVar84);
      auVar9 = vsubps_avx(auVar7,auVar17);
      auVar15._4_4_ = fStack_243c;
      auVar15._0_4_ = local_2440;
      auVar15._8_4_ = fStack_2438;
      auVar15._12_4_ = fStack_2434;
      auVar15._16_4_ = fStack_2430;
      auVar15._20_4_ = fStack_242c;
      auVar15._24_4_ = fStack_2428;
      auVar15._28_4_ = fStack_2424;
      auVar7 = vmaxps_avx(auVar15,auVar89);
      auVar7 = vminps_avx(auVar7,auVar94);
      auVar11 = vsubps_avx(auVar7,auVar15);
      auVar7 = vcvtdq2ps_avx(auVar66);
      auVar57._8_4_ = 0xbf800000;
      auVar57._0_8_ = 0xbf800000bf800000;
      auVar57._12_4_ = 0xbf800000;
      auVar57._16_4_ = 0xbf800000;
      auVar57._20_4_ = 0xbf800000;
      auVar57._24_4_ = 0xbf800000;
      auVar57._28_4_ = 0xbf800000;
      auVar7 = vcmpps_avx(auVar57,auVar7,1);
      local_24e0._4_4_ =
           auVar8._4_4_ * auVar8._4_4_ + auVar9._4_4_ * auVar9._4_4_ + auVar11._4_4_ * auVar11._4_4_
      ;
      local_24e0._0_4_ =
           auVar8._0_4_ * auVar8._0_4_ + auVar9._0_4_ * auVar9._0_4_ + auVar11._0_4_ * auVar11._0_4_
      ;
      fStack_24d8 = auVar8._8_4_ * auVar8._8_4_ + auVar9._8_4_ * auVar9._8_4_ +
                    auVar11._8_4_ * auVar11._8_4_;
      fStack_24d4 = auVar8._12_4_ * auVar8._12_4_ + auVar9._12_4_ * auVar9._12_4_ +
                    auVar11._12_4_ * auVar11._12_4_;
      fStack_24d0 = auVar8._16_4_ * auVar8._16_4_ + auVar9._16_4_ * auVar9._16_4_ +
                    auVar11._16_4_ * auVar11._16_4_;
      fStack_24cc = auVar8._20_4_ * auVar8._20_4_ + auVar9._20_4_ * auVar9._20_4_ +
                    auVar11._20_4_ * auVar11._20_4_;
      fStack_24c8 = auVar8._24_4_ * auVar8._24_4_ + auVar9._24_4_ * auVar9._24_4_ +
                    auVar11._24_4_ * auVar11._24_4_;
      fStack_24c4 = auVar8._28_4_ + auVar9._28_4_ + auVar11._28_4_;
      auVar8 = vcmpps_avx(auVar74,local_2460,5);
      auVar7 = vandps_avx(auVar8,auVar7);
      auVar8 = vcmpps_avx(auVar70,auVar74,2);
      auVar12._4_4_ = fStack_247c;
      auVar12._0_4_ = local_2480;
      auVar12._8_4_ = fStack_2478;
      auVar12._12_4_ = fStack_2474;
      auVar12._16_4_ = fStack_2470;
      auVar12._20_4_ = fStack_246c;
      auVar12._24_4_ = fStack_2468;
      auVar12._28_4_ = fStack_2464;
      auVar9 = vcmpps_avx(auVar70,auVar12,2);
      auVar8 = vandps_avx(auVar9,auVar8);
      auVar7 = vandps_avx(auVar8,auVar7);
      auVar8 = vcmpps_avx(auVar84,local_24a0,5);
      auVar9 = vcmpps_avx(auVar79,auVar59,2);
      auVar8 = vandps_avx(auVar9,auVar8);
      auVar9 = vcmpps_avx(auVar89,auVar60,2);
      auVar8 = vandps_avx(auVar8,auVar9);
      auVar7 = vandps_avx(auVar7,auVar8);
      auVar8 = vcmpps_avx(auVar94,auVar10,5);
      auVar58._8_4_ = 0xffff;
      auVar58._0_8_ = 0xffff0000ffff;
      auVar58._12_4_ = 0xffff;
      auVar58._16_4_ = 0xffff;
      auVar58._20_4_ = 0xffff;
      auVar58._24_4_ = 0xffff;
      auVar58._28_4_ = 0xffff;
      auVar49 = ZEXT3264(auVar58);
      auVar8 = vandps_avx(auVar8,auVar58);
      auVar7 = vandps_avx(auVar7,auVar8);
      auVar63 = vpackusdw_avx(auVar7._0_16_,auVar7._16_16_);
    }
    auVar63 = vpsllw_avx(auVar63,0xf);
    if ((((((((auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar63[0xf] < '\0')
    {
      auVar63 = vpacksswb_avx(auVar63,auVar63);
      bVar32 = SUB161(auVar63 >> 7,0) & 1 | (SUB161(auVar63 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar63 >> 0x17,0) & 1) << 2 | (SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar63 >> 0x27,0) & 1) << 4 | (SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar63 >> 0x37,0) & 1) << 6 | SUB161(auVar63 >> 0x3f,0) << 7;
      uVar34 = uVar33 & 0xfffffffffffffff0;
      lVar24 = 0;
      if (bVar32 != 0) {
        for (; (bVar32 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar33 = *(ulong *)(uVar34 + lVar24 * 8);
      uVar31 = bVar32 - 1 & (uint)bVar32;
      pauVar20 = pauVar28;
      if (uVar31 != 0) {
        uVar5 = *(uint *)(local_24e0 + lVar24 * 4);
        lVar24 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar34 + lVar24 * 8);
        uVar6 = *(uint *)(local_24e0 + lVar24 * 4);
        uVar31 = uVar31 - 1 & uVar31;
        if (uVar31 == 0) {
          pauVar20 = pauVar28 + 1;
          if (uVar5 < uVar6) {
            *(ulong *)*pauVar28 = uVar25;
            *(uint *)(*pauVar28 + 8) = uVar6;
          }
          else {
            *(ulong *)*pauVar28 = uVar33;
            *(uint *)(*pauVar28 + 8) = uVar5;
            uVar33 = uVar25;
          }
        }
        else {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar33;
          auVar63 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar5));
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar25;
          auVar52 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar6));
          lVar24 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
            }
          }
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(uVar34 + lVar24 * 8);
          auVar40 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_24e0 + lVar24 * 4)));
          uVar31 = uVar31 - 1 & uVar31;
          if (uVar31 == 0) {
            auVar64 = vpcmpgtd_avx(auVar52,auVar63);
            auVar65 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar52,auVar63,auVar65);
            auVar63 = vblendvps_avx(auVar63,auVar52,auVar65);
            auVar52 = vpcmpgtd_avx(auVar40,auVar64);
            auVar65 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar40,auVar64,auVar65);
            auVar40 = vblendvps_avx(auVar64,auVar40,auVar65);
            auVar64 = vpcmpgtd_avx(auVar40,auVar63);
            auVar65 = vpshufd_avx(auVar64,0xaa);
            auVar64 = vblendvps_avx(auVar40,auVar63,auVar65);
            auVar63 = vblendvps_avx(auVar63,auVar40,auVar65);
            *pauVar28 = auVar63;
            pauVar28[1] = auVar64;
            uVar33 = auVar52._0_8_;
            pauVar20 = pauVar28 + 2;
          }
          else {
            lVar24 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *(ulong *)(uVar34 + lVar24 * 8);
            auVar64 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_24e0 + lVar24 * 4)));
            uVar31 = uVar31 - 1 & uVar31;
            uVar25 = (ulong)uVar31;
            if (uVar31 == 0) {
              auVar65 = vpcmpgtd_avx(auVar52,auVar63);
              auVar69 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar52,auVar63,auVar69);
              auVar63 = vblendvps_avx(auVar63,auVar52,auVar69);
              auVar52 = vpcmpgtd_avx(auVar64,auVar40);
              auVar69 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar64,auVar40,auVar69);
              auVar40 = vblendvps_avx(auVar40,auVar64,auVar69);
              auVar64 = vpcmpgtd_avx(auVar40,auVar63);
              auVar69 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar40,auVar63,auVar69);
              auVar63 = vblendvps_avx(auVar63,auVar40,auVar69);
              auVar40 = vpcmpgtd_avx(auVar52,auVar65);
              auVar69 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar52,auVar65,auVar69);
              auVar52 = vblendvps_avx(auVar65,auVar52,auVar69);
              auVar65 = vpcmpgtd_avx(auVar64,auVar52);
              auVar69 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar64,auVar52,auVar69);
              auVar52 = vblendvps_avx(auVar52,auVar64,auVar69);
              *pauVar28 = auVar63;
              pauVar28[1] = auVar52;
              pauVar28[2] = auVar65;
              uVar33 = auVar40._0_8_;
              pauVar20 = pauVar28 + 3;
            }
            else {
              *pauVar28 = auVar63;
              pauVar28[1] = auVar52;
              pauVar28[2] = auVar40;
              pauVar28[3] = auVar64;
              lVar24 = 0x30;
              do {
                lVar29 = lVar24;
                lVar24 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                uVar33 = *(ulong *)(uVar34 + lVar24 * 8);
                auVar45._8_8_ = 0;
                auVar45._0_8_ = uVar33;
                auVar63 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_24e0 + lVar24 * 4)));
                *(undefined1 (*) [16])(pauVar28[1] + lVar29) = auVar63;
                uVar25 = uVar25 & uVar25 - 1;
                lVar24 = lVar29 + 0x10;
              } while (uVar25 != 0);
              pauVar20 = (undefined1 (*) [16])(pauVar28[1] + lVar29);
              if (lVar29 + 0x10 != 0) {
                lVar24 = 0x10;
                pauVar27 = pauVar28;
                do {
                  auVar63 = pauVar27[1];
                  pauVar27 = pauVar27 + 1;
                  uVar31 = vextractps_avx(auVar63,2);
                  lVar29 = lVar24;
                  do {
                    if (uVar31 <= *(uint *)(pauVar28[-1] + lVar29 + 8)) {
                      pauVar30 = (undefined1 (*) [16])(*pauVar28 + lVar29);
                      break;
                    }
                    *(undefined1 (*) [16])(*pauVar28 + lVar29) =
                         *(undefined1 (*) [16])(pauVar28[-1] + lVar29);
                    lVar29 = lVar29 + -0x10;
                    pauVar30 = pauVar28;
                  } while (lVar29 != 0);
                  *pauVar30 = auVar63;
                  lVar24 = lVar24 + 0x10;
                } while (pauVar20 != pauVar27);
                uVar33 = *(ulong *)*pauVar20;
              }
            }
          }
        }
      }
      goto LAB_014ddfab;
    }
    if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
      return bVar22;
    }
  }
  auVar49 = ZEXT3264(local_24c0);
  goto LAB_014de798;
LAB_014de6a0:
  do {
    local_2480 = (float)uVar26;
    fStack_247c = (float)((ulong)uVar26 >> 0x20);
    local_2460._0_8_ = lVar24;
    bVar32 = 0;
    lVar24 = 0;
    do {
      if (*(int *)(lVar29 + lVar24 * 4) == -1) break;
      uVar31 = *(uint *)(lVar29 + -0x10 + lVar24 * 4);
      this = (context->scene->geometries).items[uVar31].ptr;
      context->geomID = uVar31;
      context->primID = *(uint *)(lVar29 + lVar24 * 4);
      auVar36 = ZEXT1664(auVar36._0_16_);
      bVar21 = Geometry::pointQuery(this,query,context);
      bVar32 = bVar32 | bVar21;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 4);
    uVar26 = CONCAT71((int7)(CONCAT44(fStack_247c,local_2480) >> 8),SUB41(local_2480,0) | bVar32);
    lVar24 = local_2460._0_8_ + 1;
    lVar29 = lVar29 + 0x50;
  } while (lVar24 != local_24a0._0_8_);
  if (((uint)local_2480 & 1) == 0 && bVar32 == 0) {
    auVar49 = ZEXT3264(local_24c0);
  }
  else {
    uVar3 = *(undefined4 *)&(context->query_radius).field_0;
    auVar49 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    local_23c0 = (context->query_radius).field_0.m128[1];
    fStack_23bc = local_23c0;
    fStack_23b8 = local_23c0;
    fStack_23b4 = local_23c0;
    fStack_23b0 = local_23c0;
    fStack_23ac = local_23c0;
    fStack_23a8 = local_23c0;
    fStack_23a4 = local_23c0;
    local_23e0 = (context->query_radius).field_0.m128[2];
    fStack_23dc = local_23e0;
    fStack_23d8 = local_23e0;
    fStack_23d4 = local_23e0;
    fStack_23d0 = local_23e0;
    fStack_23cc = local_23e0;
    fStack_23c8 = local_23e0;
    fStack_23c4 = local_23e0;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar36 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      auVar63 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
      auVar36 = ZEXT1664(auVar63);
    }
    local_24f0 = auVar36._0_16_;
    bVar22 = true;
  }
LAB_014de798:
  auVar37._0_4_ = auVar49._0_4_ * auVar49._0_4_;
  auVar37._4_4_ = auVar49._4_4_ * auVar49._4_4_;
  auVar37._8_4_ = auVar49._8_4_ * auVar49._8_4_;
  auVar37._12_4_ = auVar49._12_4_ * auVar49._12_4_;
  auVar37._16_4_ = auVar49._16_4_ * auVar49._16_4_;
  auVar37._20_4_ = auVar49._20_4_ * auVar49._20_4_;
  auVar37._28_36_ = auVar36._28_36_;
  auVar37._24_4_ = auVar49._24_4_ * auVar49._24_4_;
  auVar35 = auVar37._0_32_;
  if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
    return bVar22;
  }
  goto LAB_014ddf30;
}

Assistant:

bool BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::pointQuery(
      const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
    {
      return PointQueryDispatch<N, types, robust, PrimitiveIntersector1>::pointQuery(This, query, context);
    }